

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::RGBA>
          (BinBinaryReader *this,RGBA *value)

{
  char **ppcVar1;
  uint *pos;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  
  pos = (uint *)(this->reader).cur_;
  puVar2 = (uint *)(this->reader).cap_;
  if (puVar2 < pos + 1) {
    bVar3 = fail_msg(this,"reader.read(value.value)",(char *)pos);
    uVar4 = (uint)bVar3;
  }
  else {
    uVar4 = *pos;
    *(uint *)(value->value)._M_elems = uVar4;
    ppcVar1 = &(this->reader).cur_;
    *ppcVar1 = *ppcVar1 + 4;
  }
  return (bool)(pos + 1 <= puVar2 | (byte)uVar4 & 1);
}

Assistant:

bool read(std::array<T, SIZE>& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) * SIZE > cap_) {
                return false;
            }
            memcpy(value.data(), cur_, sizeof(T) * SIZE);
            cur_ += sizeof(T) * SIZE;
            return true;
        }